

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# condexe.cc
# Opt level: O2

void __thiscall ConditionalExecution::execute(ConditionalExecution *this)

{
  PcodeOp *pPVar1;
  _Self __tmp_1;
  _List_node_base *p_Var2;
  _Self __tmp;
  _List_node_base *p_Var3;
  BlockBasic *pBVar4;
  
  fixReturnOp(this);
  if (this->directsplit == false) {
    pBVar4 = this->iblock;
    p_Var2 = (pBVar4->op).super__List_base<PcodeOp_*,_std::allocator<PcodeOp_*>_>._M_impl._M_node.
             super__List_node_base._M_next;
    while (p_Var2 != (_List_node_base *)&pBVar4->op) {
      p_Var3 = p_Var2->_M_next;
      pPVar1 = (PcodeOp *)p_Var2[1]._M_next;
      if ((pPVar1->flags & 2) == 0) {
        doReplacement(this,pPVar1);
      }
      Funcdata::opDestroy(this->fd,pPVar1);
      p_Var2 = p_Var3;
      pBVar4 = this->iblock;
    }
    Funcdata::removeFromFlowSplit(this->fd,pBVar4,this->posta_outslot != this->camethruposta_slot);
    return;
  }
  adjustDirectMulti(this);
  pBVar4 = this->iblock;
  p_Var2 = (pBVar4->op).super__List_base<PcodeOp_*,_std::allocator<PcodeOp_*>_>._M_impl._M_node.
           super__List_node_base._M_next;
  do {
    p_Var3 = p_Var2;
    do {
      if (p_Var3 == (_List_node_base *)&pBVar4->op) {
        Funcdata::switchEdge
                  (this->fd,(pBVar4->super_FlowBlock).intothis.
                            super__Vector_base<BlockEdge,_std::allocator<BlockEdge>_>._M_impl.
                            super__Vector_impl_data._M_start[this->camethruposta_slot].point,pBVar4,
                   &this->posta_block->super_FlowBlock);
        return;
      }
      p_Var2 = p_Var3->_M_next;
      pPVar1 = (PcodeOp *)p_Var3[1]._M_next;
      p_Var3 = p_Var2;
    } while (pPVar1->opcode->opcode != CPUI_MULTIEQUAL);
    doReplacement(this,pPVar1);
    Funcdata::opDestroy(this->fd,pPVar1);
    pBVar4 = this->iblock;
  } while( true );
}

Assistant:

void ConditionalExecution::execute(void)

{
  list<PcodeOp *>::iterator iter;
  PcodeOp *op;

  fixReturnOp();		// Patch any data-flow thru to CPUI_RETURN
  if (!directsplit) {
    iter = iblock->beginOp();
    while(iter != iblock->endOp()) {
      op = *iter++;
      if (!op->isBranch())
	doReplacement(op);	// Remove all read refs of op
      fd->opDestroy(op);	// Then destroy op
    }
    fd->removeFromFlowSplit(iblock,(posta_outslot != camethruposta_slot));
  }
  else {
    adjustDirectMulti();
    iter = iblock->beginOp();
    while(iter != iblock->endOp()) {
      op = *iter++;
      if (op->code() == CPUI_MULTIEQUAL) { // Only adjust MULTIEQUALs
	doReplacement(op);
	fd->opDestroy(op);
      }
      // Branch stays, other operations stay
    }
    fd->switchEdge(iblock->getIn(camethruposta_slot),iblock,posta_block);
  }
}